

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O1

void __thiscall duckdb::MetadataManager::Write(MetadataManager *this,WriteStream *sink)

{
  _Hash_node_base *p_Var1;
  size_type local_18;
  
  local_18 = (this->blocks)._M_h._M_element_count;
  (**sink->_vptr_WriteStream)(sink,&local_18,8);
  for (p_Var1 = (this->blocks)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    MetadataBlock::Write((MetadataBlock *)(p_Var1 + 2),sink);
  }
  return;
}

Assistant:

void MetadataManager::Write(WriteStream &sink) {
	sink.Write<uint64_t>(blocks.size());
	for (auto &kv : blocks) {
		kv.second.Write(sink);
	}
}